

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_abs_value(Integer g_a)

{
  long lVar1;
  Integer ndim;
  Integer type;
  Integer hi [7];
  Integer lo [7];
  long local_98;
  Integer local_90;
  Integer local_88 [8];
  Integer local_48 [7];
  
  pnga_inquire(g_a,&local_90,&local_98,local_88);
  while (lVar1 = local_98 + -1, lVar1 != -1) {
    local_48[lVar1] = 1;
    local_98 = lVar1;
  }
  _ga_sync_begin = 1;
  gai_oper_elem(g_a,local_48,local_88,(void *)0x0,0);
  return;
}

Assistant:

void pnga_abs_value(Integer g_a)
{
   Integer type, ndim;
   Integer lo[MAXDIM],hi[MAXDIM];

    pnga_inquire(g_a,  &type, &ndim, hi);
    while(ndim){
        lo[ndim-1]=1;
        ndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    gai_oper_elem(g_a, lo, hi, NULL, OP_ABS);
}